

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm_fwd.hpp
# Opt level: O2

future<std::vector<int,_std::allocator<int>_>_> * __thiscall
mxx::comm::irecv_vec<int,std::allocator<int>>
          (future<std::vector<int,_std::allocator<int>_>_> *__return_storage_ptr__,comm *this,
          size_t size,int src,int tag)

{
  undefined8 uVar1;
  MPI_Comm poVar2;
  MPI_Datatype poVar3;
  MPI_Request *ppoVar4;
  datatype dt;
  datatype dt_3;
  future_builder<std::vector<int,_std::allocator<int>_>_> f;
  
  if ((src < 0) || (this->m_size <= src)) {
    assert_fail("0 <= src && src < this->size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/comm_fwd.hpp"
                ,0x252,"irecv_vec");
  }
  future_builder<std::vector<int,_std::allocator<int>_>_>::future_builder(&f);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             f.m_future.m_data._M_t.
             super___uniq_ptr_impl<std::vector<int,_std::allocator<int>_>,_std::default_delete<std::vector<int,_std::allocator<int>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>_*,_std::default_delete<std::vector<int,_std::allocator<int>_>_>_>
             .super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>_*,_false>._M_head_impl,
             size);
  if (size < 0x7fffffff) {
    dt._vptr_datatype = (_func_int **)&PTR__datatype_00148328;
    dt.mpitype = (MPI_Datatype)&ompi_mpi_int;
    dt.builtin = true;
    uVar1 = *(undefined8 *)
             f.m_future.m_data._M_t.
             super___uniq_ptr_impl<std::vector<int,_std::allocator<int>_>,_std::default_delete<std::vector<int,_std::allocator<int>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>_*,_std::default_delete<std::vector<int,_std::allocator<int>_>_>_>
             .super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>_*,_false>._M_head_impl;
    poVar2 = this->mpi_comm;
    ppoVar4 = requests::add(&f.m_future.super_future_base<std::vector<int,_std::allocator<int>_>_>.
                             m_req);
    MPI_Irecv(uVar1,size & 0xffffffff,&ompi_mpi_int,src,tag,poVar2,ppoVar4);
  }
  else {
    dt_3._vptr_datatype = (_func_int **)&PTR__datatype_00148328;
    dt_3.mpitype = (MPI_Datatype)&ompi_mpi_int;
    dt_3.builtin = true;
    datatype::contiguous(&dt,&dt_3,size);
    datatype::~datatype(&dt_3);
    poVar3 = dt.mpitype;
    uVar1 = *(undefined8 *)
             f.m_future.m_data._M_t.
             super___uniq_ptr_impl<std::vector<int,_std::allocator<int>_>,_std::default_delete<std::vector<int,_std::allocator<int>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>_*,_std::default_delete<std::vector<int,_std::allocator<int>_>_>_>
             .super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>_*,_false>._M_head_impl;
    poVar2 = this->mpi_comm;
    ppoVar4 = requests::add(&f.m_future.super_future_base<std::vector<int,_std::allocator<int>_>_>.
                             m_req);
    MPI_Irecv(uVar1,1,poVar3,src,tag,poVar2,ppoVar4);
  }
  datatype::~datatype(&dt);
  future_builder<std::vector<int,_std::allocator<int>_>_>::get_future(__return_storage_ptr__,&f);
  future<std::vector<int,_std::allocator<int>_>_>::~future(&f.m_future);
  return __return_storage_ptr__;
}

Assistant:

inline mxx::future<std::vector<T, Alloc> > comm::irecv_vec(size_t size, int src, int tag) const {
    MXX_ASSERT(0 <= src && src < this->size());
    mxx::future_builder<std::vector<T, Alloc> > f;
    f.data()->resize(size);
    if (size < mxx::max_int) {
        mxx::datatype dt = mxx::get_datatype<T>();
        MPI_Irecv(&(f.data()->front()), size, dt.type(), src, tag, this->mpi_comm, &f.add_request());
    } else {
        mxx::datatype dt = mxx::get_datatype<T>().contiguous(size);
        MPI_Irecv(&(f.data()->front()), 1, dt.type(), src, tag, this->mpi_comm, &f.add_request());
    }
    return f.get_future();
}